

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaCheckUnionTypeDefCircularRecur
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypePtr ctxType,xmlSchemaTypeLinkPtr members)

{
  byte *pbVar1;
  xmlSchemaTypePtr type;
  int iVar2;
  xmlSchemaTypeLinkPtr members_00;
  xmlSchemaTypePtr *ppxVar3;
  
  do {
    if (members == (xmlSchemaTypeLinkPtr)0x0) {
      return 0;
    }
    ppxVar3 = &members->type;
    while ((type = *ppxVar3, type != (xmlSchemaTypePtr)0x0 && (type->type != XML_SCHEMA_TYPE_BASIC))
          ) {
      if (type == ctxType) {
        xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_SRC_SIMPLE_TYPE_4,(xmlSchemaBasicItemPtr)ctxType,
                            (xmlNodePtr)0x0,"The union type definition is circular",(xmlChar *)0x0);
        return 0xbbb;
      }
      if ((type->flags & 0x10080U) == 0x80) {
        type->flags = type->flags | 0x10000;
        members_00 = xmlSchemaGetUnionSimpleTypeMemberTypes(type);
        iVar2 = xmlSchemaCheckUnionTypeDefCircularRecur(pctxt,ctxType,members_00);
        pbVar1 = (byte *)((long)&type->flags + 2);
        *pbVar1 = *pbVar1 ^ 1;
        if (iVar2 != 0) {
          return iVar2;
        }
      }
      ppxVar3 = &type->baseType;
    }
    members = members->next;
  } while( true );
}

Assistant:

static int
xmlSchemaCheckUnionTypeDefCircularRecur(xmlSchemaParserCtxtPtr pctxt,
					xmlSchemaTypePtr ctxType,
					xmlSchemaTypeLinkPtr members)
{
    xmlSchemaTypeLinkPtr member;
    xmlSchemaTypePtr memberType;

    member = members;
    while (member != NULL) {
	memberType = member->type;
	while ((memberType != NULL) &&
	    (memberType->type != XML_SCHEMA_TYPE_BASIC)) {
	    if (memberType == ctxType) {
		xmlSchemaPCustomErr(pctxt,
		    XML_SCHEMAP_SRC_SIMPLE_TYPE_4,
		    WXS_BASIC_CAST ctxType, NULL,
		    "The union type definition is circular", NULL);
		return (XML_SCHEMAP_SRC_SIMPLE_TYPE_4);
	    }
	    if ((WXS_IS_UNION(memberType)) &&
		((memberType->flags & XML_SCHEMAS_TYPE_MARKED) == 0))
	    {
		int res;
		memberType->flags |= XML_SCHEMAS_TYPE_MARKED;
		res = xmlSchemaCheckUnionTypeDefCircularRecur(pctxt,
		    ctxType,
		    xmlSchemaGetUnionSimpleTypeMemberTypes(memberType));
		memberType->flags ^= XML_SCHEMAS_TYPE_MARKED;
		if (res != 0)
		    return(res);
	    }
	    memberType = memberType->baseType;
	}
	member = member->next;
    }
    return(0);
}